

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O3

DancingNode *
createToridolMatrix(vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                    *Matrix,int nRow,int nCol,
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   *ProbMat,DancingNode *header)

{
  long *plVar1;
  int *piVar2;
  pointer pvVar3;
  long lVar4;
  pointer pvVar5;
  long lVar6;
  long lVar7;
  s_DancingNode *psVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  
  if (-1 < nRow) {
    pvVar3 = (ProbMat->
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar18 = 0;
    do {
      if (0 < nCol) {
        lVar4 = *(long *)&pvVar3[uVar18].super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data;
        pvVar5 = (Matrix->
                 super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar17 = 0;
        do {
          uVar16 = 1L << ((byte)uVar17 & 0x3f);
          uVar19 = uVar17 >> 6 & 0x3ffffff;
          if ((*(ulong *)(lVar4 + uVar19 * 8) >> (uVar17 & 0x3f) & 1) != 0) {
            lVar6 = *(long *)&(pvVar5->
                              super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>).
                              _M_impl.super__Vector_impl_data;
            if (uVar18 != 0) {
              piVar2 = (int *)(lVar6 + 0x30 + uVar17 * 0x38);
              *piVar2 = *piVar2 + 1;
            }
            lVar15 = uVar17 * 0x38;
            lVar7 = *(long *)&pvVar5[uVar18].
                              super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>.
                              _M_impl;
            plVar1 = (long *)(lVar7 + lVar15);
            *(long *)(lVar7 + 0x20 + lVar15) = lVar6 + lVar15;
            *(int *)(lVar7 + 0x28 + lVar15) = (int)uVar18;
            *(int *)(lVar7 + 0x2c + lVar15) = (int)uVar17;
            uVar12 = uVar17 & 0xffffffff;
            do {
              iVar13 = (int)uVar12;
              if ((int)uVar12 < 1) {
                iVar13 = nCol;
              }
              uVar10 = iVar13 - 1;
              uVar12 = (ulong)uVar10;
              uVar11 = iVar13 + 0x3e;
              if (-1 < (int)uVar10) {
                uVar11 = uVar10;
              }
            } while ((uVar17 != uVar12) &&
                    ((1L << ((byte)uVar10 & 0x3f) &
                     *(ulong *)((long)((int)uVar11 >> 6) * 8 + lVar4 + -8 +
                               (ulong)(((long)(int)uVar10 & 0x800000000000003fU) <
                                      0x8000000000000001) * 8)) == 0));
            *plVar1 = (long)(int)uVar10 * 0x38 + lVar7;
            uVar12 = uVar17 & 0xffffffff;
            do {
              uVar9 = (long)((int)uVar12 + 1) % (long)nCol;
              uVar12 = uVar9 & 0xffffffff;
              iVar14 = (int)uVar9;
              iVar13 = iVar14 + 0x3f;
              if (-1 < iVar14) {
                iVar13 = iVar14;
              }
            } while ((uVar17 != uVar12) &&
                    ((1L << ((byte)uVar9 & 0x3f) &
                     *(ulong *)((long)(iVar13 >> 6) * 8 + lVar4 + -8 +
                               (ulong)(((long)iVar14 & 0x800000000000003fU) < 0x8000000000000001) *
                               8)) == 0));
            plVar1[1] = lVar7 + (long)iVar14 * 0x38;
            uVar12 = uVar18 & 0xffffffff;
            do {
              iVar13 = (int)uVar12;
              if ((int)uVar12 < 1) {
                iVar13 = nRow;
              }
              uVar11 = iVar13 - 1;
              uVar12 = (ulong)uVar11;
            } while ((uVar18 != uVar12) &&
                    ((*(ulong *)(*(long *)&pvVar3[(int)uVar11].
                                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                                           super__Bvector_impl_data + uVar19 * 8) & uVar16) == 0));
            plVar1[2] = *(long *)&pvVar5[(int)uVar11].
                                  super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>.
                                  _M_impl + lVar15;
            uVar12 = uVar18 & 0xffffffff;
            do {
              uVar9 = (long)((int)uVar12 + 1) % (long)nRow;
              uVar12 = (ulong)(int)uVar9;
              if (uVar18 == (uVar9 & 0xffffffff)) break;
            } while ((*(ulong *)(*(long *)&pvVar3[uVar12].super__Bvector_base<std::allocator<bool>_>
                                           ._M_impl.super__Bvector_impl_data + uVar19 * 8) & uVar16)
                     == 0);
            plVar1[3] = lVar15 + *(long *)&pvVar5[uVar12].
                                           super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>
                                           ._M_impl;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != (uint)nCol);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != nRow + 1);
  }
  psVar8 = (((Matrix->
             super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  header->right = psVar8;
  header->left = psVar8 + (long)nCol + -1;
  psVar8->left = header;
  psVar8[(long)nCol + -1].right = header;
  return header;
}

Assistant:

DancingNode *createToridolMatrix(vector<vector<DancingNode>> &Matrix, int nRow, int nCol, vector<vector<bool>> &ProbMat, DancingNode *header) 
{ 
    // One extra row for list header nodes 
    // for each column 
    for(int i = 0; i <= nRow; i++) 
    { 
        for(int j = 0; j < nCol; j++) 
        { 
            // If it's 1 in the problem matrix then  
            // only create a node  
            if(ProbMat[i][j]) 
            {   
                int a, b; 
                //Matrix[i].push_back(DancingNode()); 
                // If it's 1, other than 1 in 0th row 
                // then count it as node of column  
                // and increment node count in column header 
                if(i) Matrix[0][j].nodeCount += 1; 
  
                // Add pointer to column header for this  
                // column node 
                Matrix[i][j].column = &Matrix[0][j]; 
  
                // set row and column id of this node 
                Matrix[i][j].row = i; 
                Matrix[i][j].col = j; 
  
                // Link the node with neighbors 
                // Left pointer 
                a = i; b = j; 
                do{ b = getLeft(b, nCol); } while(!ProbMat[a][b] && b != j); 
                Matrix[i][j].left = &Matrix[i][b]; 
                
                // Right pointer 
                a = i; b = j; 
                do { b = getRight(b, nCol); } while(!ProbMat[a][b] && b != j); 
                Matrix[i][j].right = &Matrix[i][b]; 
                
                // Up pointer 
                a = i; b = j; 
                do { a = getUp(a, nRow); } while(!ProbMat[a][b] && a != i); 
                Matrix[i][j].up = &Matrix[a][j]; 
  
                // Down pointer 
                a = i; b = j; 
                do { a = getDown(a, nRow); } while(!ProbMat[a][b] && a != i); 
                Matrix[i][j].down = &Matrix[a][j]; 
                
            } 
        } 
    } 
  
    // link header right pointer to column  
    // header of first column  
    header->right = &Matrix[0][0]; 
  
    // link header left pointer to column  
    // header of last column  
    header->left = &Matrix[0][nCol-1]; 
  
    Matrix[0][0].left = header; 
    Matrix[0][nCol-1].right = header; 
    return header; 
}